

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int row;
  int col;
  ostream *poVar2;
  char *pcVar3;
  
  system("clear");
  if (argc < 2) {
    pcVar3 = "Too few arguments!\n";
  }
  else if ((uint)argc < 7) {
    if (argc == 2) {
      iVar1 = atoi(argv[1]);
      if (iVar1 - 0x65U < 0xffffff9c) goto LAB_00102450;
      std::operator<<((ostream *)&std::cout,"\nUsing default number for rows and columns: 10x10\n\n"
                     );
LAB_00102496:
      row = 10;
      col = row;
LAB_00102499:
      poVar2 = std::operator<<((ostream *)&std::cout,"Number of puzzles: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Number of rows: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,row);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Number of columns: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,col);
      std::endl<char,std::char_traits<char>>(poVar2);
      puzzle_Generator(row,col,iVar1);
      return 0;
    }
    row = atoi(argv[2]);
    if (row - 0x11U < 0xfffffff6) {
      pcVar3 = "Number of rows is out of range!\n";
    }
    else {
      col = atoi(argv[4]);
      if (0xfffffff5 < col - 0x11U) {
        iVar1 = strcmp(argv[1],"--rows");
        if ((iVar1 != 0) || (iVar1 = strcmp(argv[3],"--cols"), iVar1 != 0)) goto LAB_00102450;
        if (argc == 6) {
          iVar1 = atoi(argv[5]);
          if (iVar1 - 0x65U < 0xffffff9c) goto LAB_00102450;
          goto LAB_00102499;
        }
        iVar1 = 1;
        goto LAB_00102496;
      }
      pcVar3 = "Number of columns is out of range!\n";
    }
  }
  else {
    pcVar3 = "Too many arguments!\n";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00102450:
  printHelp();
  return 1;
}

Assistant:

int main ( int argc, char const *argv[])
{
    system("clear");

    int puzzles = NPUZZLE; //! Number of puzzles
    int rows = DFT_ROW; //! Number of rows
    int columns = DFT_COL; //! Number of columns

	//! Verifies the valid amount of arguments to the program's execution
    if( argc < 2 )
    {
        std::cout << "Too few arguments!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( argc > 6 )
    {
        std::cout << "Too many arguments!\n" << std::endl;
        printHelp();
        return EXIT_FAILURE;
    }

	/*! If the amount of arguments is equal to 2 (<executable> [number of puzzles]),
	 *  puzzles receives the value of argv[1]
	 */
    else if( argc == 2 )
    {
        puzzles = atoi(argv[1]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();
            return EXIT_FAILURE;
        }

        std::cout << "\nUsing default number for rows and columns: 10x10\n\n";
    }
	//* Verifies the interval of values allowed for rows and columns
    else if( atoi(argv[2]) < MIN_ROW or atoi(argv[2]) > MAX_ROW )
    {
        std::cout << "Number of rows is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( atoi(argv[4]) < MIN_COL or atoi(argv[4]) > MAX_COL )
    {
        std::cout << "Number of columns is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    } 
	//* Verifies if the user entered the right arguments to inform the rows and columns
    else if( strcmp( argv[1], "--rows" ) != 0 or strcmp( argv[3], "--cols" ) != 0 ) 
	{
        printHelp();

        return EXIT_FAILURE;
    }
	/*! Last verification. If everything's fine, the values of the
	 *  parameters are assigned
	 */ 
    else if( argc == 6 and ( strcmp( argv[1], "--rows" ) == 0 ) and ( strcmp( argv[3], "--cols" ) == 0 ) )
	{
        puzzles = atoi(argv[5]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();

            return EXIT_FAILURE;
        }

        rows = atoi(argv[2]);
        columns = atoi(argv[4]);
    }

    std::cout << "Number of puzzles: " << puzzles << std::endl;
    std::cout << "Number of rows: " << rows << std::endl;
    std::cout << "Number of columns: " << columns << std::endl;

    puzzle_Generator( rows, columns, puzzles );

    return EXIT_SUCCESS;
 }